

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_timer_perform_single(void *timer_,void *ignr)

{
  long *plVar1;
  
  (**(code **)((long)timer_ + 0x30))(*(undefined8 *)((long)timer_ + 0x38));
  if (*(long *)((long)timer_ + 0x28) != 0) {
    plVar1 = (long *)((long)timer_ + 0x28);
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      if (*(code **)((long)timer_ + 0x40) != (code *)0x0) {
        (**(code **)((long)timer_ + 0x40))(*(undefined8 *)((long)timer_ + 0x38));
      }
      free(timer_);
      return;
    }
  }
  fio_timer_add_order((fio_timer_s *)timer_);
  return;
}

Assistant:

static void fio_timer_perform_single(void *timer_, void *ignr) {
  fio_timer_s *timer = timer_;
  timer->task(timer->arg);
  if (!timer->repetitions || fio_atomic_sub(&timer->repetitions, 1))
    goto reschedule;
  if (timer->on_finish)
    timer->on_finish(timer->arg);
  free(timer);
  return;
  (void)ignr;
reschedule:
  fio_timer_add_order(timer);
}